

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
delta_complex_t::vertex_filtration
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,delta_complex_t *this)

{
  pointer pvVar1;
  pointer pdVar2;
  delta_complex_cell_t *pdVar3;
  delta_complex_cell_t c;
  value_t local_114;
  delta_complex_cell_t local_110;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = *(pointer *)
            ((long)&(pvVar1->
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>)
                    ._M_impl + 8);
  for (pdVar3 = *(delta_complex_cell_t **)
                 &(pvVar1->
                  super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>).
                  _M_impl; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
    delta_complex_cell_t::delta_complex_cell_t(&local_110,pdVar3);
    local_114 = local_110.filt;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,&local_114);
    delta_complex_cell_t::~delta_complex_cell_t(&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value_t> vertex_filtration(){
		std::vector<value_t> out;
		for( auto c : cells[0] ){
			out.push_back(c.filtration());
		}
        return out;
    }